

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_authorization.c
# Opt level: O1

uint64_t IoTHubClient_Auth_Get_SasToken_Expiry(IOTHUB_AUTHORIZATION_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  uint64_t uVar2;
  
  if (handle == (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                ,"IoTHubClient_Auth_Get_SasToken_Expiry",0x28b,1,"Invalid handle value handle: NULL"
               );
    }
  }
  else {
    uVar2 = handle->token_expiry_time_sec;
  }
  return uVar2;
}

Assistant:

uint64_t IoTHubClient_Auth_Get_SasToken_Expiry(IOTHUB_AUTHORIZATION_HANDLE handle)
{
    uint64_t result;
    if (handle == NULL)
    {
        LogError("Invalid handle value handle: NULL");
        result = 0;
    }
    else
    {
        result = handle->token_expiry_time_sec;
    }
    return result;
}